

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

int __thiscall QTreeWidget::topLevelItemCount(QTreeWidget *this)

{
  QTreeModel *pQVar1;
  
  pQVar1 = QTreeWidgetPrivate::treeModel
                     (*(QTreeWidgetPrivate **)
                       &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8);
  return (int)(pQVar1->rootItem->children).d.size;
}

Assistant:

int QTreeWidget::topLevelItemCount() const
{
    Q_D(const QTreeWidget);
    return d->treeModel()->rootItem->childCount();
}